

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O2

void __thiscall t_json_generator::generate_field(t_json_generator *this,t_field *field)

{
  _Base_ptr p_Var1;
  char *this_00;
  allocator local_1d1;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  start_object(this,true);
  std::__cxx11::string::string((string *)&local_90,"key",(allocator *)&local_1d0);
  write_key_and_integer(this,&local_90,field->key_);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_b0,"name",(allocator *)&local_1d0);
  std::__cxx11::string::string((string *)&local_d0,(string *)&field->name_);
  write_key_and_string(this,&local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  this_00 = "typeId";
  std::__cxx11::string::string((string *)&local_f0,"typeId",(allocator *)&local_1d0);
  get_type_name_abi_cxx11_(&local_110,(t_json_generator *)this_00,field->type_);
  write_key_and_string(this,&local_f0,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  write_type_spec_object(this,"type",field->type_);
  if ((field->super_t_doc).has_doc_ == true) {
    std::__cxx11::string::string((string *)&local_130,"doc",(allocator *)&local_1d0);
    std::__cxx11::string::string((string *)&local_150,(string *)&(field->super_t_doc).doc_);
    write_key_and_string(this,&local_130,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
  }
  if ((field->annotations_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string((string *)&local_170,"annotations",(allocator *)&local_1d0);
    write_key_and(this,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    start_object(this,true);
    for (p_Var1 = (field->annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(field->annotations_)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      std::__cxx11::string::string((string *)&local_50,(string *)(p_Var1 + 1));
      std::__cxx11::string::string((string *)&local_70,(string *)(p_Var1 + 2));
      write_key_and_string(this,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    end_object(this);
  }
  std::__cxx11::string::string((string *)&local_190,"required",(allocator *)&local_1d0);
  write_key_and(this,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  if (field->req_ == T_REQUIRED) {
    std::__cxx11::string::string((string *)&local_1d0,"required",&local_1d1);
    write_string(this,&local_1d0);
  }
  else if (field->req_ == T_OPT_IN_REQ_OUT) {
    std::__cxx11::string::string((string *)&local_1d0,"req_out",&local_1d1);
    write_string(this,&local_1d0);
  }
  else {
    std::__cxx11::string::string((string *)&local_1d0,"optional",&local_1d1);
    write_string(this,&local_1d0);
  }
  std::__cxx11::string::~string((string *)&local_1d0);
  if (field->value_ != (t_const_value *)0x0) {
    std::__cxx11::string::string((string *)&local_1b0,"default",(allocator *)&local_1d0);
    write_key_and(this,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    write_const_value(this,field->value_,false);
  }
  end_object(this);
  return;
}

Assistant:

void t_json_generator::generate_field(t_field* field) {
  start_object();

  write_key_and_integer("key", field->get_key());
  write_key_and_string("name", field->get_name());
  write_key_and_string("typeId", get_type_name(field->get_type()));
  write_type_spec_object("type", field->get_type());

  if (field->has_doc()) {
    write_key_and_string("doc", field->get_doc());
  }

  if (field->annotations_.size() > 0) {
    write_key_and("annotations");
    start_object();
    for (auto & annotation : field->annotations_) {
      write_key_and_string(annotation.first, annotation.second);
    }
    end_object();
  }

  write_key_and("required");
  switch (field->get_req()) {
  case t_field::T_REQUIRED:
    write_string("required");
    break;
  case t_field::T_OPT_IN_REQ_OUT:
    write_string("req_out");
    break;
  default:
    write_string("optional");
    break;
  }

  if (field->get_value()) {
    write_key_and("default");
    write_const_value(field->get_value());
  }

  end_object();
}